

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_statement(Parser *this,bool in_func)

{
  Type TVar1;
  pointer pTVar2;
  pointer pTVar3;
  AbstractSyntaxNode *pAVar4;
  char *pcVar5;
  ostream *poVar6;
  parser_exception *ppVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000031;
  Token *this_00;
  stringstream buffer;
  TokenPosition local_290;
  string local_278;
  Type local_258 [4];
  ostream local_248 [112];
  ios_base local_1d8 [264];
  Token local_d0;
  Token local_78;
  
  local_258[0] = kStatement;
  pAVar4 = AbstractSyntaxNode::add_child
                     (this->current_,local_258,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)local_258);
  if ((int)CONCAT71(in_register_00000031,in_func) == 0) {
    pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar1 = pTVar2[this->index_ % this->total_].type_;
    if (TVar1 == kIdentity) {
      if (pTVar2[(this->index_ + 1) % this->total_].type_ == kLeftParen) goto LAB_0013302b;
    }
    else if ((TVar1 - kRead < 4) || (TVar1 == kReturn)) {
LAB_0013302b:
      std::__ostream_insert<char,std::char_traits<char>>(local_248,"\"",1);
      pcVar5 = Token::token_type_name
                         (&(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>.
                           _M_impl.super__Vector_impl_data._M_start[this->index_ % this->total_].
                           type_);
      poVar6 = std::operator<<(local_248,pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,anon_var_dwarf_985d8,0x20);
      ppVar7 = (parser_exception *)__cxa_allocate_exception(0x40);
      iVar9 = this->index_ % this->total_;
      pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar3 = pTVar2 + iVar9;
      local_290.super_Position.row_ = (pTVar3->position_).super_Position.row_;
      local_290.super_Position.col_ = (pTVar3->position_).super_Position.col_;
      local_290.super_Position._vptr_Position = (_func_int **)&PTR_clear_001539d0;
      local_290.length_ = pTVar2[iVar9].position_.length_;
      std::__cxx11::stringbuf::str();
      parser_exception::parser_exception(ppVar7,&local_290,&local_278);
      __cxa_throw(ppVar7,&parser_exception::typeinfo,parser_exception::~parser_exception);
    }
  }
  iVar9 = this->total_;
  pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar1 = pTVar2[this->index_ % iVar9].type_;
  switch(TVar1) {
  case kRead:
    parse_read_statement(this);
    break;
  case kWrite:
    parse_write_statement(this);
    break;
  case kWhile:
    parse_while_statement(this);
    break;
  case kIf:
    parse_if_statement(this);
    break;
  default:
    if (TVar1 == kIdentity) {
      iVar8 = this->index_ + 1;
      if (pTVar2[iVar8 % iVar9].type_ != kLeftParen) {
        parse_assign_statement(this);
        break;
      }
      if (pTVar2[iVar8 % iVar9].type_ != kLeftParen) goto LAB_00132f97;
      parse_function_call(this);
      local_278._M_dataplus._M_p._0_4_ = 0x11;
      match(&local_78,this,(Type *)&local_278);
      this_00 = &local_78;
    }
    else {
LAB_00132f97:
      if (TVar1 == kReturn) {
        parse_return_statement(this);
        break;
      }
      if (TVar1 - kInt < 3) {
        parse_declare_statement(this);
        break;
      }
      if (TVar1 != kSemicolon) {
        std::__ostream_insert<char,std::char_traits<char>>(local_248,anon_var_dwarf_985ac,0x14);
        Token::content_abi_cxx11_
                  (&local_278,
                   (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Vector_impl_data._M_start + this->index_ % this->total_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_248,
                            (char *)CONCAT44(local_278._M_dataplus._M_p._4_4_,
                                             local_278._M_dataplus._M_p._0_4_),
                            local_278._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,anon_var_dwarf_985ee,0x2f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_) !=
            &local_278.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_
                                  ));
        }
        ppVar7 = (parser_exception *)__cxa_allocate_exception(0x40);
        iVar9 = this->index_ % this->total_;
        pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar3 = pTVar2 + iVar9;
        local_290.super_Position.row_ = (pTVar3->position_).super_Position.row_;
        local_290.super_Position.col_ = (pTVar3->position_).super_Position.col_;
        local_290.super_Position._vptr_Position = (_func_int **)&PTR_clear_001539d0;
        local_290.length_ = pTVar2[iVar9].position_.length_;
        std::__cxx11::stringbuf::str();
        parser_exception::parser_exception(ppVar7,&local_290,&local_278);
        __cxa_throw(ppVar7,&parser_exception::typeinfo,parser_exception::~parser_exception);
      }
      local_278._M_dataplus._M_p._0_4_ = 0x11;
      match(&local_d0,this,(Type *)&local_278);
      this_00 = &local_d0;
    }
    Token::~Token(this_00);
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_258);
  std::ios_base::~ios_base(local_1d8);
  return;
}

Assistant:

void Parser::parse_statement(bool in_func) {
    current_ = current_->add_child(Token::Type::kStatement, forward_token());
    std::stringstream buffer;

    if (!in_func && (forward_token().type() == Token::Type::kIf ||
                     forward_token().type() == Token::Type::kWhile ||
                     forward_token().type() == Token::Type::kRead ||
                     forward_token().type() == Token::Type::kWrite ||
                     (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftParen) ||
                     forward_token().type() == Token::Type::kReturn)) {
        buffer << "\"" << forward_token().type_name() << "\" 语句位于函数体外无效";
        throw parser_exception(forward_token().position(), buffer.str());
    }


    if (forward_token().type() == Token::Type::kIf) {
        parse_if_statement();
    } else if (forward_token().type() == Token::Type::kWhile) {
        parse_while_statement();
    } else if (forward_token().type() == Token::Type::kRead) {
        parse_read_statement();
    } else if (forward_token().type() == Token::Type::kWrite) {
        parse_write_statement();
    } else if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() != Token::Type::kLeftParen) {
        parse_assign_statement();
    } else if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftParen) {
        parse_function_call();
        match(Token::Type::kSemicolon);
    } else if (forward_token().type() == Token::Type::kReturn) {
        parse_return_statement();
    } else if (is_declare_keyword(forward_token().type())) {
        parse_declare_statement();
    } else if (forward_token().type() == Token::Type::kSemicolon) {
        match(Token::Type::kSemicolon);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 无法解析该语句, 请确认是否合法";
        throw parser_exception(forward_token().position(), buffer.str());
    }

    current_ = current_->parent();
}